

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCss::Pseudo>::clear(QList<QCss::Pseudo> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QCss::Pseudo> *this_00;
  __off_t __length;
  QArrayDataPointer<QCss::Pseudo> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QCss::Pseudo> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QCss::Pseudo> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QCss::Pseudo> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QCss::Pseudo>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QCss::Pseudo>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QCss::Pseudo> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QCss::Pseudo>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QCss::Pseudo>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QCss::Pseudo>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QCss::Pseudo>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QCss::Pseudo> *)
                QArrayDataPointer<QCss::Pseudo>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QCss::Pseudo>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }